

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallGenerator::AddInstallRule
          (cmInstallGenerator *this,ostream *os,string *dest,cmInstallType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,bool optional,char *permissions_file,char *permissions_dir,char *rename,
          char *literal_args,Indent *indent)

{
  bool bVar1;
  char *in_name;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pbVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  const_iterator fi_1;
  string absDest;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  const_iterator fi;
  string local_58 [8];
  string stype;
  bool optional_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  cmInstallType type_local;
  string *dest_local;
  ostream *os_local;
  cmInstallGenerator *this_local;
  
  stype.field_2._M_local_buf[0xf] = optional;
  std::__cxx11::string::string(local_58);
  switch(type) {
  case cmInstallType_EXECUTABLE:
    std::__cxx11::string::operator=(local_58,"EXECUTABLE");
    break;
  case cmInstallType_STATIC_LIBRARY:
    std::__cxx11::string::operator=(local_58,"STATIC_LIBRARY");
    break;
  case cmInstallType_SHARED_LIBRARY:
    std::__cxx11::string::operator=(local_58,"SHARED_LIBRARY");
    break;
  case cmInstallType_MODULE_LIBRARY:
    std::__cxx11::string::operator=(local_58,"MODULE");
    break;
  case cmInstallType_FILES:
    std::__cxx11::string::operator=(local_58,"FILE");
    break;
  case cmInstallType_PROGRAMS:
    std::__cxx11::string::operator=(local_58,"PROGRAM");
    break;
  case cmInstallType_DIRECTORY:
    std::__cxx11::string::operator=(local_58,"DIRECTORY");
  }
  ::operator<<(os,indent);
  in_name = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
  if (bVar1) {
    std::operator<<(os,"list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n");
    poVar2 = ::operator<<(os,indent);
    std::operator<<(poVar2," \"");
    local_70._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(files);
    while( true ) {
      local_78._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(files);
      bVar1 = __gnu_cxx::operator!=(&local_70,&local_78);
      if (!bVar1) break;
      local_80._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(files);
      bVar1 = __gnu_cxx::operator!=(&local_70,&local_80);
      if (bVar1) {
        std::operator<<(os,";");
      }
      poVar2 = std::operator<<(os,(string *)dest);
      std::operator<<(poVar2,"/");
      if ((rename == (char *)0x0) || (*rename == '\0')) {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_70);
        cmsys::SystemTools::GetFilenameName((string *)((long)&absDest.field_2 + 8),pbVar5);
        std::operator<<(os,(string *)(absDest.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(absDest.field_2._M_local_buf + 8));
      }
      else {
        std::operator<<(os,rename);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_70);
    }
    std::operator<<(os,"\")\n");
    poVar2 = ::operator<<(os,indent);
    std::operator<<(poVar2,"if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n");
    poVar2 = ::operator<<(os,indent);
    poVar2 = ::operator<<(poVar2,indent);
    poVar2 = std::operator<<(poVar2,"message(WARNING \"ABSOLUTE path INSTALL ");
    std::operator<<(poVar2,"DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n");
    poVar2 = ::operator<<(os,indent);
    std::operator<<(poVar2,"endif()\n");
    poVar2 = ::operator<<(os,indent);
    std::operator<<(poVar2,"if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n");
    poVar2 = ::operator<<(os,indent);
    poVar2 = ::operator<<(poVar2,indent);
    poVar2 = std::operator<<(poVar2,"message(FATAL_ERROR \"ABSOLUTE path INSTALL ");
    poVar2 = std::operator<<(poVar2,"DESTINATION forbidden (by caller): ");
    std::operator<<(poVar2,"${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n");
    poVar2 = ::operator<<(os,indent);
    std::operator<<(poVar2,"endif()\n");
  }
  ConvertToAbsoluteDestination((string *)&fi_1,this,dest);
  poVar2 = std::operator<<(os,"file(INSTALL DESTINATION \"");
  poVar2 = std::operator<<(poVar2,(string *)&fi_1);
  poVar2 = std::operator<<(poVar2,"\" TYPE ");
  std::operator<<(poVar2,local_58);
  if ((stype.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::operator<<(os," OPTIONAL");
  }
  switch(this->Message) {
  case MessageDefault:
    break;
  case MessageAlways:
    std::operator<<(os," MESSAGE_ALWAYS");
    break;
  case MessageLazy:
    std::operator<<(os," MESSAGE_LAZY");
    break;
  case MessageNever:
    std::operator<<(os," MESSAGE_NEVER");
  }
  if ((permissions_file != (char *)0x0) && (*permissions_file != '\0')) {
    poVar2 = std::operator<<(os," PERMISSIONS");
    std::operator<<(poVar2,permissions_file);
  }
  if ((permissions_dir != (char *)0x0) && (*permissions_dir != '\0')) {
    poVar2 = std::operator<<(os," DIR_PERMISSIONS");
    std::operator<<(poVar2,permissions_dir);
  }
  if ((rename != (char *)0x0) && (*rename != '\0')) {
    poVar2 = std::operator<<(os," RENAME \"");
    poVar2 = std::operator<<(poVar2,rename);
    std::operator<<(poVar2,"\"");
  }
  std::operator<<(os," FILES");
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(files);
  if (sVar3 == 1) {
    poVar2 = std::operator<<(os," \"");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](files,0);
    poVar2 = std::operator<<(poVar2,(string *)pvVar4);
    std::operator<<(poVar2,"\"");
  }
  else {
    local_c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(files);
    while( true ) {
      local_d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(files);
      bVar1 = __gnu_cxx::operator!=(&local_c8,&local_d0);
      if (!bVar1) break;
      poVar2 = std::operator<<(os,"\n");
      poVar2 = ::operator<<(poVar2,indent);
      poVar2 = std::operator<<(poVar2,"  \"");
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_c8);
      poVar2 = std::operator<<(poVar2,(string *)pbVar5);
      std::operator<<(poVar2,"\"");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_c8);
    }
    poVar2 = std::operator<<(os,"\n");
    poVar2 = ::operator<<(poVar2,indent);
    std::operator<<(poVar2," ");
    if ((literal_args == (char *)0x0) || (*literal_args == '\0')) {
      std::operator<<(os," ");
    }
  }
  if ((literal_args != (char *)0x0) && (*literal_args != '\0')) {
    std::operator<<(os,literal_args);
  }
  std::operator<<(os,")\n");
  std::__cxx11::string::~string((string *)&fi_1);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void cmInstallGenerator
::AddInstallRule(
                 std::ostream& os,
                 std::string const& dest,
                 cmInstallType type,
                 std::vector<std::string> const& files,
                 bool optional /* = false */,
                 const char* permissions_file /* = 0 */,
                 const char* permissions_dir /* = 0 */,
                 const char* rename /* = 0 */,
                 const char* literal_args /* = 0 */,
                 Indent const& indent
                 )
{
  // Use the FILE command to install the file.
  std::string stype;
  switch(type)
    {
    case cmInstallType_DIRECTORY:      stype = "DIRECTORY"; break;
    case cmInstallType_PROGRAMS:       stype = "PROGRAM"; break;
    case cmInstallType_EXECUTABLE:     stype = "EXECUTABLE"; break;
    case cmInstallType_STATIC_LIBRARY: stype = "STATIC_LIBRARY"; break;
    case cmInstallType_SHARED_LIBRARY: stype = "SHARED_LIBRARY"; break;
    case cmInstallType_MODULE_LIBRARY: stype = "MODULE"; break;
    case cmInstallType_FILES:          stype = "FILE"; break;
    }
  os << indent;
  if (cmSystemTools::FileIsFullPath(dest.c_str()))
     {
     os << "list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n";
     os << indent << " \"";
     for(std::vector<std::string>::const_iterator fi = files.begin();
               fi != files.end(); ++fi)
             {
               if (fi!=files.begin())
                 {
                 os << ";";
                 }
               os << dest << "/";
               if (rename && *rename)
                 {
                 os << rename;
                 }
               else
                 {
                 os << cmSystemTools::GetFilenameName(*fi);
                 }
             }
     os << "\")\n";
     os << indent << "if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
     os << indent << indent << "message(WARNING \"ABSOLUTE path INSTALL "
        << "DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
     os << indent << "endif()\n";

     os << indent << "if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
     os << indent << indent << "message(FATAL_ERROR \"ABSOLUTE path INSTALL "
        << "DESTINATION forbidden (by caller): "
        << "${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
     os << indent << "endif()\n";
     }
  std::string absDest = this->ConvertToAbsoluteDestination(dest);
  os << "file(INSTALL DESTINATION \"" << absDest << "\" TYPE " << stype;
  if(optional)
    {
    os << " OPTIONAL";
    }
  switch(this->Message)
    {
    case MessageDefault: break;
    case MessageAlways: os << " MESSAGE_ALWAYS"; break;
    case MessageLazy:   os << " MESSAGE_LAZY"; break;
    case MessageNever:  os << " MESSAGE_NEVER"; break;
    }
  if(permissions_file && *permissions_file)
    {
    os << " PERMISSIONS" << permissions_file;
    }
  if(permissions_dir && *permissions_dir)
    {
    os << " DIR_PERMISSIONS" << permissions_dir;
    }
  if(rename && *rename)
    {
    os << " RENAME \"" << rename << "\"";
    }
  os << " FILES";
  if(files.size() == 1)
    {
    os << " \"" << files[0] << "\"";
    }
  else
    {
    for(std::vector<std::string>::const_iterator fi = files.begin();
        fi != files.end(); ++fi)
      {
      os << "\n" << indent << "  \"" << *fi << "\"";
      }
    os << "\n" << indent << " ";
    if(!(literal_args && *literal_args))
      {
      os << " ";
      }
    }
  if(literal_args && *literal_args)
    {
    os << literal_args;
    }
  os << ")\n";
}